

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

int __thiscall SimpleCV::Core::Image::getPixel(Image *this,int x,int y)

{
  pointer piVar1;
  out_of_range *this_00;
  undefined8 uVar2;
  ulong uVar3;
  
  if ((-1 < x) && (-1 < y)) {
    if ((x < this->width) && (y < this->height)) {
      uVar3 = (ulong)(uint)(this->width * y + x);
      piVar1 = (this->pixels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar3 < (ulong)((long)(this->pixels).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_finish - (long)piVar1 >> 2)) {
        return piVar1[uVar3];
      }
      uVar2 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
      __cxa_free_exception();
      _Unwind_Resume(uVar2);
    }
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Out of bounds access");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

int Image::getPixel(const int x, const int y) const
{
	if (x < 0 || x >= width || y < 0 || y >= height)
		throw std::out_of_range("Out of bounds access");

	return pixels.at(y*width + x);
}